

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i,real a)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  int64_t iVar4;
  real *prVar5;
  int64_t j;
  long j_00;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x8d,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  iVar4 = Matrix::size(&this->super_Matrix,0);
  if ((long)(ulong)(uint)i < iVar4) {
    pfVar1 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = Matrix::size(&this->super_Matrix,1);
    if ((long)pfVar1 - (long)pfVar2 >> 2 == iVar4) {
      for (j_00 = 0; j_00 < (this->super_Matrix).n_; j_00 = j_00 + 1) {
        prVar5 = at(this,(ulong)(uint)i,j_00);
        pfVar1 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)*prVar5),ZEXT416((uint)a),ZEXT416((uint)pfVar1[j_00])
                                );
        pfVar1[j_00] = auVar3._0_4_;
      }
      return;
    }
    __assert_fail("x.size() == this->size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x8f,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                ,0x8e,
                "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i, real a) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < n_; j++) {
    x[j] += a * at(i, j);
  }
}